

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O2

int matchPat(atom *a,pattern *pat)

{
  int iVar1;
  int iVar2;
  float fVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  char *__s2;
  bool bVar7;
  bool bVar8;
  char acStack_98 [112];
  
LAB_00125e05:
  if (pat == (pattern *)0x0) {
switchD_00125e28_caseD_137:
    return 0;
  }
  switch(pat->type) {
  case 300:
    iVar4 = matchPat(a,pat->lhs);
    if (iVar4 != 0) {
      return 1;
    }
    goto LAB_00125e4e;
  case 0x12d:
    iVar4 = matchPat(a,pat->lhs);
    if (iVar4 == 0) {
      return 0;
    }
LAB_00125e4e:
    pat = pat->rhs;
    goto LAB_00125e05;
  case 0x12e:
    iVar4 = matchPat(a,pat->lhs);
    goto LAB_0012605a;
  case 0x12f:
    iVar4 = a->r->resid;
    if (iVar4 < pat->lhs->val) {
      return 0;
    }
    iVar1 = pat->rhs->val;
    bVar8 = SBORROW4(iVar4,iVar1);
    iVar2 = iVar4 - iVar1;
    bVar7 = iVar4 == iVar1;
    goto LAB_00125fbc;
  case 0x130:
    iVar4 = a->r->file;
    goto LAB_00125f95;
  case 0x131:
    iVar4 = a->r->model;
    goto LAB_00125f95;
  case 0x132:
    pcVar5 = lexString(pat->val);
    sVar6 = strlen(pcVar5);
    iVar4 = (int)sVar6;
    pcVar5 = lexString(pat->val);
    __s2 = a->r->chain;
    break;
  case 0x133:
    iVar4 = (int)a->altConf;
    if (iVar4 == 0x20) {
      return 1;
    }
    goto LAB_00125efd;
  case 0x134:
    iVar4 = a->r->resid;
LAB_00125f95:
    bVar7 = iVar4 == pat->val;
    goto LAB_0012605e;
  case 0x135:
    pcVar5 = lexString(pat->val);
    sVar6 = strlen(pcVar5);
    iVar4 = (int)sVar6;
    pcVar5 = lexString(pat->val);
    __s2 = a->r->resname;
    break;
  case 0x136:
    return 1;
  case 0x137:
    goto switchD_00125e28_caseD_137;
  case 0x138:
    return pat->val & a->props;
  case 0x139:
    pcVar5 = lexString(pat->val);
    sVar6 = strlen(pcVar5);
    pcVar5 = lexString(pat->val);
    __s2 = a->atomname;
    iVar4 = (int)sVar6;
    break;
  case 0x13a:
    fVar3 = (float)pat->val / 100.0;
    bVar7 = fVar3 == a->occ;
    bVar8 = fVar3 < a->occ;
    goto LAB_00125fde;
  case 0x13b:
    fVar3 = (float)pat->val / 100.0;
    bVar7 = a->occ == fVar3;
    bVar8 = a->occ < fVar3;
    goto LAB_00125fde;
  case 0x13c:
    bVar7 = (float)pat->val == a->bval;
    bVar8 = (float)pat->val < a->bval;
    goto LAB_00125fde;
  case 0x13d:
    bVar7 = a->bval == (float)pat->val;
    bVar8 = a->bval < (float)pat->val;
LAB_00125fde:
    return (uint)(!bVar8 && !bVar7);
  case 0x13e:
    iVar4 = atomWithinDistance(a,pat->fvec);
    return iVar4;
  case 0x13f:
    pcVar5 = lexString(pat->val);
    sVar6 = strlen(pcVar5);
    iVar4 = (int)sVar6;
    pcVar5 = lexString(pat->val);
    __s2 = a->r->segid;
    break;
  case 0x140:
    iVar4 = (int)a->r->resInsCode;
LAB_00125efd:
    bVar7 = pat->val == iVar4;
    goto LAB_0012605e;
  case 0x141:
    iVar4 = pat->lhs->val;
    if (iVar4 == 0x12d) {
      iVar4 = pat->lhs->lhs->val;
    }
    iVar1 = a->r->resid;
    if (iVar1 < iVar4) {
      return 0;
    }
    iVar4 = pat->rhs->val;
    if (iVar4 == 0x12d) {
      iVar4 = pat->rhs->lhs->val;
    }
    bVar8 = SBORROW4(iVar1,iVar4);
    iVar2 = iVar1 - iVar4;
    bVar7 = iVar1 == iVar4;
LAB_00125fbc:
    return (uint)(bVar7 || bVar8 != iVar2 < 0);
  default:
    sprintf(acStack_98,"unknown pattern type: %d");
    halt(acStack_98);
    goto switchD_00125e28_caseD_137;
  }
  iVar4 = strncmp(pcVar5,__s2,(long)iVar4);
LAB_0012605a:
  bVar7 = iVar4 == 0;
LAB_0012605e:
  return (uint)bVar7;
}

Assistant:

int matchPat(atom *a, pattern *pat)
{
  int lp, rc = FALSE;

  if (pat)
  {
   switch(pat->type)
   {
   case     OR_NODE: rc = matchPat(a, pat->lhs) ?
			   TRUE : matchPat(a, pat->rhs); break;
   case    AND_NODE: rc = matchPat(a, pat->lhs) ?
			   matchPat(a, pat->rhs) : FALSE; break;
   case    NOT_NODE: rc = !matchPat(a, pat->lhs); break;
   case   FILE_NODE: rc = (a->r->file  == pat->val); break;
   case  MODEL_NODE: rc = (a->r->model == pat->val); break;
   case  CHAIN_NODE: lp = strlen(lexString(pat->val));
                     rc = (strncmp(lexString(pat->val), a->r->chain, lp)
                                                            == 0); break;
   case    ALT_NODE: rc = (a->altConf == ' ' || a->altConf == pat->val); break;
   case    RES_NODE: rc = (a->r->resid == pat->val); break;
   case  RANGE_NODE: rc = (pat->lhs->val <= a->r->resid
                             && a->r->resid <= pat->rhs->val); break;
   case  RTYPE_NODE: lp = strlen(lexString(pat->val));
		     rc = (strncmp(lexString(pat->val), a->r->resname, lp)
							    == 0); break;
   case   DIST_NODE: rc = atomWithinDistance(a, pat->fvec); break;
   case   PROP_NODE: rc = (a->props & pat->val); break;
   case  ANAME_NODE: lp = strlen(lexString(pat->val));
		     rc = (strncmp(lexString(pat->val), a->atomname, lp)
							    == 0); break;
   case  SEGID_NODE: lp = strlen(lexString(pat->val));
		     rc = (strncmp(lexString(pat->val), a->r->segid, lp)
							    == 0); break;
   case   TRUE_NODE: rc = TRUE;  break;
   case  FALSE_NODE: rc = FALSE; break;
   case OCC_LT_NODE: rc = (a->occ  < pat->val/100.0); break;
   case OCC_GT_NODE: rc = (a->occ  > pat->val/100.0); break;
   case   B_LT_NODE: rc = (a->bval < pat->val); break;
   case   B_GT_NODE: rc = (a->bval > pat->val); break;
   case    INS_NODE: rc = (a->r->resInsCode == pat->val); break;

 /* ignores the insertion code */
   case INS_RANGE_NODE: rc = (((pat->lhs->val == AND_NODE)
                                ? pat->lhs->lhs->val
				: pat->lhs->val)
				<= a->r->resid
                             && a->r->resid <=
			      ((pat->rhs->val == AND_NODE)
                                ? pat->rhs->lhs->val
				: pat->rhs->val));
			break;
   default: { char msg[100];
         sprintf(msg, "unknown pattern type: %d", pat->type);
         halt(msg);
      }
   }/*switch*/
  }
  return rc;
}